

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EmptyTimingCheckArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyTimingCheckArgSyntax,slang::syntax::EmptyTimingCheckArgSyntax_const&>
          (BumpAllocator *this,EmptyTimingCheckArgSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  EmptyTimingCheckArgSyntax *pEVar8;
  
  pEVar8 = (EmptyTimingCheckArgSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_TimingCheckArgSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingCheckArgSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_TimingCheckArgSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->placeholder).kind;
  uVar5 = (args->placeholder).field_0x2;
  NVar6.raw = (args->placeholder).numFlags.raw;
  uVar7 = (args->placeholder).rawLen;
  (pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.kind =
       (args->super_TimingCheckArgSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.parent = pSVar1;
  (pEVar8->super_TimingCheckArgSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pEVar8->placeholder).kind = TVar4;
  (pEVar8->placeholder).field_0x2 = uVar5;
  (pEVar8->placeholder).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar8->placeholder).rawLen = uVar7;
  (pEVar8->placeholder).info = (args->placeholder).info;
  return pEVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }